

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QString * __thiscall QAccessibleComboBox::text(QAccessibleComboBox *this,Text t)

{
  bool bVar1;
  QComboBox *pQVar2;
  int in_EDX;
  QComboBox *in_RSI;
  QAccessibleWidget *in_RDI;
  long in_FS_OFFSET;
  QComboBox *cBox;
  QString *str;
  QString *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  QAccessibleWidget *this_00;
  Text t_00;
  QAccessibleWidget *this_01;
  QKeySequence local_58 [8];
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->super_QAccessibleActionInterface = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  pQVar2 = in_RSI;
  this_01 = in_RDI;
  QString::QString((QString *)0x7d519b);
  t_00 = (Text)((ulong)pQVar2 >> 0x20);
  pQVar2 = comboBox((QAccessibleComboBox *)0x7d51a5);
  if (pQVar2 != (QComboBox *)0x0) {
    if ((in_EDX == 0) || (in_EDX == 2)) {
      bVar1 = QComboBox::isEditable((QComboBox *)CONCAT44(in_EDX,in_stack_ffffffffffffff50));
      if (bVar1) {
        QComboBox::lineEdit((QComboBox *)CONCAT44(in_EDX,in_stack_ffffffffffffff50));
        QLineEdit::text((QLineEdit *)this_00);
        QString::operator=((QString *)CONCAT44(in_EDX,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff48);
        QString::~QString((QString *)0x7d522a);
      }
      else {
        QComboBox::currentText(in_RSI);
        QString::operator=((QString *)CONCAT44(in_EDX,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff48);
        QString::~QString((QString *)0x7d525d);
      }
    }
    else if (in_EDX == 4) {
      QKeySequence::QKeySequence(local_58,0x1000015,0,0,0);
      QKeySequence::toString((SequenceFormat)local_50);
      QString::operator=((QString *)CONCAT44(in_EDX,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x7d52a1);
      QKeySequence::~QKeySequence(local_58);
    }
    bVar1 = QString::isEmpty((QString *)0x7d52b9);
    if (bVar1) {
      QAccessibleWidget::text(this_01,t_00);
      QString::operator=((QString *)CONCAT44(in_EDX,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x7d52eb);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleComboBox::text(QAccessible::Text t) const
{
    QString str;
    if (QComboBox *cBox = comboBox()) {
        switch (t) {
        case QAccessible::Name:
#ifndef Q_OS_UNIX // on Linux we use relations for this, name is text (fall through to Value)
        str = QAccessibleWidget::text(t);
        break;
#endif
        case QAccessible::Value:
            if (cBox->isEditable())
                str = cBox->lineEdit()->text();
            else
                str = cBox->currentText();
            break;
#ifndef QT_NO_SHORTCUT
        case QAccessible::Accelerator:
            str = QKeySequence(Qt::Key_Down).toString(QKeySequence::NativeText);
            break;
#endif
        default:
            break;
        }
        if (str.isEmpty())
            str = QAccessibleWidget::text(t);
    }
    return str;
}